

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svlogd.c
# Opt level: O1

int buffer_pread(int fd,char *s,uint len)

{
  uint64 *puVar1;
  int iVar2;
  ssize_t sVar3;
  int *piVar4;
  ulong uVar5;
  long lVar6;
  
  if (dirn != 0) {
    lVar6 = 0x10;
    uVar5 = 0;
    do {
      buffer_flush((buffer *)((long)&dir->fddir + lVar6));
      uVar5 = uVar5 + 1;
      lVar6 = lVar6 + 0xf0;
    } while (uVar5 < dirn);
  }
  if (rotateasap != 0) {
    if (dirn != 0) {
      lVar6 = 0;
      uVar5 = 0;
      do {
        rotate((logdir *)((long)&dir->fddir + lVar6));
        uVar5 = uVar5 + 1;
        lVar6 = lVar6 + 0xf0;
      } while (uVar5 < dirn);
    }
    rotateasap = 0;
  }
  if (exitasap != 0) {
    if (linecomplete != 0) {
      return 0;
    }
    len = 1;
  }
  if (reopenasap != 0) {
    logdirs_reopen();
    reopenasap = 0;
  }
  taia_now(&now);
  taia_uint(&trotate,0xab8);
  taia_add(&trotate,&now,&trotate);
  if (dirn != 0) {
    lVar6 = 0x68;
    uVar5 = 0;
    do {
      if (*(long *)((long)dir + lVar6 + -8) != 0) {
        iVar2 = taia_less((taia *)((long)&dir->fddir + lVar6),&now);
        if (iVar2 != 0) {
          rotate((logdir *)((long)dir + lVar6 + -0x68));
        }
        iVar2 = taia_less((taia *)((long)&dir->fddir + lVar6),&trotate);
        if (iVar2 != 0) {
          puVar1 = (uint64 *)((long)&dir->fddir + lVar6);
          trotate.sec.x = *puVar1;
          trotate.nano = puVar1[1];
          trotate.atto = *(unsigned_long *)((long)&(dir->b).x + lVar6);
        }
      }
      uVar5 = uVar5 + 1;
      lVar6 = lVar6 + 0xf0;
    } while (uVar5 < dirn);
  }
  sig_unblock(sig_term);
  sig_unblock(sig_child);
  sig_unblock(sig_alarm);
  sig_unblock(sig_hangup);
  iopause(&in,1,&trotate,&now);
  sig_block(sig_term);
  sig_block(sig_child);
  sig_block(sig_alarm);
  sig_block(sig_hangup);
  sVar3 = read(fd,s,(ulong)len);
  iVar2 = (int)sVar3;
  if (iVar2 == -1) {
    piVar4 = __errno_location();
    if (*piVar4 == error_again) {
      *piVar4 = error_intr;
    }
    if (*piVar4 != error_intr) {
      strerr_warn("svlogd: warning: ","unable to read standard input",": ",(char *)0x0,(char *)0x0,
                  (char *)0x0,&strerr_sys);
    }
  }
  if (0 < iVar2) {
    linecomplete = (uint)(s[iVar2 - 1] == '\n');
  }
  return iVar2;
}

Assistant:

int buffer_pread(int fd, char *s, unsigned int len) {
  int i;

  for (i =0; i < dirn; ++i) buffer_flush(&dir[i].b);
  if (rotateasap) {
    for (i =0; i < dirn; ++i) rotate(dir +i);
    rotateasap =0;
  }
  if (exitasap) {
    if (linecomplete) return(0);
    len =1;
  }
  if (reopenasap) {
    logdirs_reopen();
    reopenasap =0;
  }
  taia_now(&now);
  taia_uint(&trotate, 2744);
  taia_add(&trotate, &now, &trotate);
  for (i =0; i < dirn; ++i)
    if ((dir +i)->tmax) {
      if (taia_less(&dir[i].trotate, &now)) rotate(dir +i);
      if (taia_less(&dir[i].trotate, &trotate)) trotate =dir[i].trotate;
    }
  sig_unblock(sig_term);
  sig_unblock(sig_child);
  sig_unblock(sig_alarm);
  sig_unblock(sig_hangup);
  iopause(&in, 1, &trotate, &now);
  sig_block(sig_term);
  sig_block(sig_child);
  sig_block(sig_alarm);
  sig_block(sig_hangup);
  i =read(fd, s, len);
  if (i == -1) {
    if (errno == error_again) errno =error_intr;
    if (errno != error_intr) warn("unable to read standard input");
  }
  if (i > 0) linecomplete =(s[i -1] == '\n');
  return(i);
}